

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

void * lua_touserdata(lua_State *L,int idx)

{
  TValue *pTVar1;
  int in_ESI;
  lua_State *in_RDI;
  cTValue *o;
  void *local_8;
  
  pTVar1 = index2adr(in_RDI,in_ESI);
  if ((pTVar1->field_2).it == 0xfffffff3) {
    local_8 = (void *)((ulong)(pTVar1->u32).lo + 0x18);
  }
  else if ((int)(pTVar1->field_2).it >> 0xf == -2) {
    local_8 = (void *)(pTVar1->u64 & 0x7fffffffffff);
  }
  else {
    local_8 = (void *)0x0;
  }
  return local_8;
}

Assistant:

LUA_API void *lua_touserdata(lua_State *L, int idx)
{
  cTValue *o = index2adr(L, idx);
  if (tvisudata(o))
    return uddata(udataV(o));
  else if (tvislightud(o))
    return lightudV(o);
  else
    return NULL;
}